

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::XFBGlobalBufferTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBGlobalBufferTest *this,GLuint test_case_index)

{
  reference pvVar1;
  _testCase *test_case;
  GLuint test_case_index_local;
  XFBGlobalBufferTest *this_local;
  string *name;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pvVar1 = std::
           vector<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBGlobalBufferTest::_testCase>_>
           ::operator[](&this->m_test_cases,(ulong)test_case_index);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Tested stage: ");
  Utils::Shader::GetStageName(pvVar1->m_stage);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  Utils::Type::GetGLSLTypeName(&pvVar1->m_type);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string XFBGlobalBufferTest::getTestCaseName(GLuint test_case_index)
{
	std::string		 name;
	const _testCase& test_case = m_test_cases[test_case_index];

	name = "Tested stage: ";
	name.append(Utils::Shader::GetStageName(test_case.m_stage));
	name.append(". Tested type: ");
	name.append(test_case.m_type.GetGLSLTypeName());

	return name;
}